

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQStringTable::Remove(SQStringTable *this,SQString *bs)

{
  long lVar1;
  ulong uVar2;
  SQInteger slen;
  SQHash h;
  SQString *prev;
  SQString *s;
  SQString *bs_local;
  SQStringTable *this_local;
  
  h = 0;
  uVar2 = bs->_hash & this->_numofslots - 1;
  prev = this->_strings[uVar2];
  while( true ) {
    if (prev == (SQString *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                    ,0x286,"void SQStringTable::Remove(SQString *)");
    }
    if (prev == bs) break;
    h = (SQHash)prev;
    prev = prev->_next;
  }
  if (h == 0) {
    this->_strings[uVar2] = prev->_next;
  }
  else {
    *(SQString **)(h + 0x20) = prev->_next;
  }
  this->_slotused = this->_slotused - 1;
  lVar1 = prev->_len;
  (**(prev->super_SQRefCounted)._vptr_SQRefCounted)();
  sq_vm_free(prev,lVar1 + 0x40);
  return;
}

Assistant:

void SQStringTable::Remove(SQString *bs)
{
    SQString *s;
    SQString *prev=NULL;
    SQHash h = bs->_hash&(_numofslots - 1);

    for (s = _strings[h]; s; ){
        if(s == bs){
            if(prev)
                prev->_next = s->_next;
            else
                _strings[h] = s->_next;
            _slotused--;
            SQInteger slen = s->_len;
            s->~SQString();
            SQ_FREE(s,sizeof(SQString) + sq_rsl(slen));
            return;
        }
        prev = s;
        s = s->_next;
    }
    assert(0);//if this fail something is wrong
}